

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::ScopedTrace::PushTrace(ScopedTrace *this,char *file,int line,string *message)

{
  size_type *psVar1;
  undefined1 local_48 [8];
  TraceInfo trace;
  
  psVar1 = &trace.message._M_string_length;
  trace.message._M_dataplus._M_p = (pointer)0x0;
  trace.message._M_string_length._0_1_ = 0;
  local_48 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  trace._8_8_ = psVar1;
  std::__cxx11::string::swap((string *)&trace.line);
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,(TraceInfo *)local_48);
  if ((size_type *)trace._8_8_ != psVar1) {
    operator_delete((void *)trace._8_8_);
  }
  return;
}

Assistant:

void ScopedTrace::PushTrace(const char* file, int line, std::string message) {
  internal::TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message.swap(message);

  UnitTest::GetInstance()->PushGTestTrace(trace);
}